

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O1

char * __thiscall kj::StringTree::flattenTo(StringTree *this,char *target,char *limit)

{
  size_t sVar1;
  Branch *pBVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  StringTree *this_00;
  char *local_48;
  anon_class_16_2_77190bd5 local_40;
  
  local_40.target = &local_48;
  sVar1 = (this->branches).size_;
  local_48 = target;
  local_40.limit = limit;
  if (sVar1 == 0) {
    uVar7 = 0;
    local_40.target = &local_48;
  }
  else {
    pBVar2 = (this->branches).ptr;
    lVar5 = sVar1 << 6;
    uVar7 = 0;
    do {
      this_00 = &pBVar2->content;
      uVar3 = *(ulong *)((long)(this_00 + -1) + 0x30) - uVar7;
      if (uVar7 <= *(ulong *)((long)(this_00 + -1) + 0x30) && uVar3 != 0) {
        pcVar6 = "";
        if ((this->text).content.size_ != 0) {
          pcVar6 = (this->text).content.ptr;
        }
        uVar4 = (long)limit - (long)local_48;
        if (uVar3 < (ulong)((long)limit - (long)local_48)) {
          uVar4 = uVar3;
        }
        memcpy(local_48,pcVar6 + uVar7,uVar4);
        local_48 = local_48 + uVar4;
        uVar7 = *(ulong *)((long)(this_00 + -1) + 0x30);
      }
      visit<kj::StringTree::flattenTo(char*,char*)const::__0&>(this_00,&local_40);
      pBVar2 = (Branch *)(this_00 + 1);
      lVar5 = lVar5 + -0x40;
    } while (lVar5 != 0);
  }
  sVar1 = (this->text).content.size_;
  uVar3 = 0;
  if (sVar1 != 0) {
    uVar3 = sVar1 - 1;
  }
  uVar4 = uVar3 - uVar7;
  if (uVar7 <= uVar3 && uVar4 != 0) {
    if (sVar1 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (this->text).content.ptr;
    }
    uVar3 = (long)limit - (long)local_48;
    if (uVar4 < (ulong)((long)limit - (long)local_48)) {
      uVar3 = uVar4;
    }
    memcpy(local_48,pcVar6 + uVar7,uVar3);
    local_48 = local_48 + uVar3;
  }
  return local_48;
}

Assistant:

char* StringTree::flattenTo(char* __restrict__ target, char* limit) const {
  visit([&target,limit](ArrayPtr<const char> text) {
    size_t size = kj::min(text.size(), limit - target);
    memcpy(target, text.begin(), size);
    target += size;
  });
  return target;
}